

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTypes.cpp
# Opt level: O2

String __thiscall MiniScript::Value::ToString(Value *this,Machine *vm)

{
  long *plVar1;
  unsigned_long uVar2;
  FuncParam *pFVar3;
  undefined8 uVar4;
  double dVar5;
  double in_RDX;
  double extraout_RDX;
  double extraout_RDX_00;
  double extraout_RDX_01;
  String *this_00;
  List<MiniScript::FuncParam> *this_01;
  long lVar6;
  double dVar7;
  String SVar8;
  String s;
  String local_78;
  Value local_68;
  double local_58;
  undefined8 uStack_50;
  Value local_48;
  StringStorage *local_38;
  
  this_00 = &s;
  switch(*(undefined1 *)&vm->standardOutput) {
  case 1:
    local_58 = *(double *)&vm->storeImplicit;
    uStack_50 = 0;
    dVar7 = fmod(local_58,1.0);
    if ((((dVar7 == 0.0) && (!NAN(dVar7))) || (10000000000.0 < ABS(local_58))) ||
       (ABS(local_58) < 1e-06)) {
      SVar8 = String::Format(local_58,(char *)this);
      in_RDX = SVar8._8_8_;
      goto LAB_0013eb8c;
    }
    String::Format(local_58,(char *)this);
    lVar6 = *(long *)this;
    if (lVar6 == 0) {
      in_RDX = 0.0;
    }
    else {
      in_RDX = (double)(*(long *)(lVar6 + 0x18) - 1);
    }
    while (dVar7 = in_RDX, in_RDX = (double)((long)dVar7 - 1), 1 < (long)in_RDX) {
      if ((*(char *)(*(long *)(lVar6 + 0x10) + -1 + (long)dVar7) != '0') ||
         (*(char *)(*(long *)(lVar6 + 0x10) + -2 + (long)dVar7) == '.')) goto LAB_0013ebd6;
    }
    if (lVar6 == 0) {
      dVar5 = 0.0;
      goto LAB_0013ebdd;
    }
LAB_0013ebd6:
    dVar5 = (double)(*(long *)(lVar6 + 0x18) - 1);
LAB_0013ebdd:
    if ((ulong)dVar5 <= (ulong)dVar7) goto LAB_0013eb8c;
    String::SubstringB(&s,(long)this,0);
    String::operator=((String *)this,&s);
    break;
  case 2:
    String::String(&s,"_");
    String::Format(&local_78,*(int *)&vm->storeImplicit,"%d");
    String::operator+((String *)this,&s);
LAB_0013eb6d:
    String::~String(&local_78);
    this_00 = &s;
    break;
  case 3:
    if (*(long *)&vm->storeImplicit == 0) {
      uVar4 = 0;
    }
    else {
      plVar1 = (long *)(*(long *)&vm->storeImplicit + 8);
      *plVar1 = *plVar1 + 1;
      uVar4 = *(undefined8 *)&vm->storeImplicit;
    }
    this->type = (char)uVar4;
    this->noInvoke = (bool)(char)((ulong)uVar4 >> 8);
    this->localOnly = (char)((ulong)uVar4 >> 0x10);
    *(int5 *)&this->field_0x3 = (int5)((ulong)uVar4 >> 0x18);
    goto LAB_0013eadd;
  case 4:
  case 5:
    SVar8 = CodeForm(this,vm,SUB84(in_RDX,0));
    in_RDX = SVar8._8_8_;
    goto LAB_0013eb8c;
  case 6:
    local_58 = in_RDX;
    local_38 = (StringStorage *)this;
    String::String(&s,"FUNCTION(");
    this_01 = (List<MiniScript::FuncParam> *)(*(long *)&vm->storeImplicit + 0x10);
    lVar6 = 0;
    while( true ) {
      this = (Value *)local_38;
      if (this_01->ls == (ListStorage<MiniScript::FuncParam> *)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = (this_01->ls->super_SimpleVector<MiniScript::FuncParam>).mQtyItems;
      }
      if ((long)uVar2 <= lVar6) break;
      if (lVar6 != 0) {
        String::String(&local_78,", ");
        String::Append(&s,&local_78);
        String::~String(&local_78);
      }
      pFVar3 = List<MiniScript::FuncParam>::operator[](this_01,lVar6);
      String::Append(&s,&pFVar3->name);
      pFVar3 = List<MiniScript::FuncParam>::operator[](this_01,lVar6);
      if ((pFVar3->defaultValue).type != Null) {
        String::String((String *)&local_48,"=");
        pFVar3 = List<MiniScript::FuncParam>::operator[](this_01,lVar6);
        CodeForm(&local_68,(Machine *)&pFVar3->defaultValue,SUB84(local_58,0));
        String::operator+(&local_78,(String *)&local_48);
        String::Append(&s,&local_78);
        String::~String(&local_78);
        String::~String((String *)&local_68);
        String::~String((String *)&local_48);
      }
      lVar6 = lVar6 + 1;
    }
    String::operator+((String *)local_38,(char *)&s);
    this_00 = &s;
    break;
  case 7:
    if (*(long *)&vm->storeImplicit == 0) {
      s.ss = (StringStorage *)0x0;
    }
    else {
      plVar1 = (long *)(*(long *)&vm->storeImplicit + 8);
      *plVar1 = *plVar1 + 1;
      s.ss = *(StringStorage **)&vm->storeImplicit;
    }
    s.isTemp = false;
    if (*(char *)((long)&vm->standardOutput + 1) == '\x01') {
      String::String(&local_78,"@");
      String::operator+((String *)this,&local_78);
      goto LAB_0013eb6d;
    }
    String::String((String *)this,&s);
    this_00 = &s;
    break;
  case 8:
    lVar6 = *(long *)&vm->storeImplicit;
    ToString(&local_48,(Machine *)(lVar6 + 0x10));
    String::operator+(&local_78,(char *)&local_48);
    ToString(&local_68,(Machine *)(lVar6 + 0x20));
    String::operator+(&s,&local_78);
    String::operator+((String *)this,(char *)&s);
    String::~String(&s);
    String::~String((String *)&local_68);
    String::~String(&local_78);
    String::~String((String *)&local_48);
    in_RDX = extraout_RDX;
    if (*(char *)((long)&vm->standardOutput + 1) != '\x01') goto LAB_0013eb8c;
    String::String(&local_78,"@");
    String::operator+(&s,&local_78);
    String::operator=((String *)this,&s);
    String::~String(&s);
    this_00 = &local_78;
    break;
  case 9:
    String::String((String *)this,"Handle");
    in_RDX = extraout_RDX_00;
    goto LAB_0013eb8c;
  default:
    this->type = Null;
    this->noInvoke = false;
    this->localOnly = Off;
    *(undefined5 *)&this->field_0x3 = 0;
LAB_0013eadd:
    *(undefined1 *)&this->data = 0;
    goto LAB_0013eb8c;
  }
  String::~String(this_00);
  in_RDX = extraout_RDX_01;
LAB_0013eb8c:
  SVar8._8_8_ = in_RDX;
  SVar8.ss = (StringStorage *)this;
  return SVar8;
}

Assistant:

String Value::ToString(Machine *vm) {
		if (type == ValueType::Number) {
			// Convert number to string in the standard Miniscript way.
			double value = data.number;
			if (fmod(value, 1.0) == 0.0) {
				return String::Format(value, "%.0f");
			} else if (value > 1E10 || value < -1E10 || (value < 1E-6 && value > -1E-6)) {
				// very large/small numbers in exponential form
				return String::Format(value, "%.6E");
			} else {
				// all others in decimal form, with 1-6 digits past the decimal point
				String s = String::Format(value, "%.6f");
				long i = s.LengthB() - 1;
				while (i > 1 && s[i] == '0' && s[i-1] != '.') i--;
				if (i+1 < s.LengthB()) s = s.SubstringB(0, i+1);
				return s;
			}
		}
		if (type == ValueType::String) { retain(); return String((StringStorage*)data.ref, false); }
		if (type == ValueType::List) return CodeForm(vm, 3);
		if (type == ValueType::Map) return CodeForm(vm, 3);
		if (type == ValueType::Var) {
			retain();
			String ident((StringStorage*)data.ref, false);
			if (noInvoke) return String("@") + ident;
			return ident;
		}
		if (type == ValueType::Temp) return String("_") + String::Format((int)data.tempNum);
		if (type == ValueType::Function) {
			String s("FUNCTION(");
			FunctionStorage *fs = (FunctionStorage*)data.ref;
			for (long i=0; i < fs->parameters.Count(); i++) {
				if (i > 0) s += ", ";
				s += fs->parameters[i].name;
				if (not fs->parameters[i].defaultValue.IsNull()) s += String("=") + fs->parameters[i].defaultValue.CodeForm(vm);
			}
			return s + ")";
		}
		if (type == ValueType::SeqElem) {
			SeqElemStorage *se = (SeqElemStorage*)data.ref;
			String s = se->sequence.ToString(vm) + "[" + se->index.ToString(vm) + "]";
			if (noInvoke) s = String("@") + s;
			return s;
		}
		if (type == ValueType::Handle) {
			return "Handle";
		}
		return String();
	}